

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::sse42::BVHNIntersector1<4,_16781328,_false,_embree::sse42::VirtualCurveIntersector1>::
     intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float fVar5;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  undefined8 uVar10;
  long lVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  uint uVar18;
  ulong uVar19;
  AABBNodeMB4D *node1;
  ulong uVar20;
  RayQueryContext *extraout_RDX;
  undefined1 (*pauVar21) [16];
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  int iVar25;
  float fVar26;
  float fVar27;
  float fVar46;
  float fVar48;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  float fVar47;
  float fVar49;
  float fVar50;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  vint4 bi;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  float fVar55;
  float fVar56;
  float fVar63;
  float fVar65;
  vfloat4 a0;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  float fVar64;
  float fVar66;
  float fVar67;
  float fVar68;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  float fVar74;
  float fVar75;
  vint4 ai_3;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  float fVar76;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  float fVar82;
  float fVar89;
  float fVar90;
  vint4 bi_1;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar95;
  float fVar96;
  vint4 ai;
  undefined1 auVar94 [16];
  float fVar97;
  float fVar99;
  float fVar100;
  vint4 ai_1;
  undefined1 auVar98 [16];
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar105;
  undefined1 auVar104 [16];
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  vfloat<4> tNear;
  Precalculations pre;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_1108 [16];
  undefined8 local_10f8;
  undefined8 uStack_10f0;
  float local_10e8;
  float fStack_10e4;
  float fStack_10e0;
  float fStack_10dc;
  float local_10d8;
  float fStack_10d4;
  float fStack_10d0;
  float fStack_10cc;
  RayHit *local_10c0;
  Intersectors *local_10b8;
  RayQueryContext *local_10b0;
  float local_10a8;
  float fStack_10a4;
  float fStack_10a0;
  float fStack_109c;
  float local_1098;
  float fStack_1094;
  float fStack_1090;
  float fStack_108c;
  float local_1088;
  float fStack_1084;
  float fStack_1080;
  float fStack_107c;
  float local_1078;
  float fStack_1074;
  float fStack_1070;
  float fStack_106c;
  undefined1 local_1068 [16];
  float local_1058;
  float fStack_1054;
  float fStack_1050;
  float fStack_104c;
  float local_1048;
  float fStack_1044;
  float fStack_1040;
  float fStack_103c;
  float local_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  undefined8 local_1028;
  undefined8 uStack_1020;
  float local_1018;
  float fStack_1014;
  float fStack_1010;
  float fStack_100c;
  float local_1008;
  float fStack_1004;
  float fStack_1000;
  float fStack_ffc;
  float local_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  float local_fb8 [4];
  undefined1 local_fa8 [16];
  undefined1 local_f98 [16];
  undefined1 local_f88 [16];
  long local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  
  local_10b0 = context;
  local_10b8 = This;
  local_f78 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_f78 != 8) {
    aVar6 = (ray->super_RayK<1>).dir.field_0.field_1;
    local_1048 = aVar6.x;
    local_1058 = aVar6.y;
    local_1038 = aVar6.z;
    auVar28 = dpps((undefined1  [16])aVar6,(undefined1  [16])aVar6,0x7f);
    auVar57 = rsqrtss(auVar28,auVar28);
    fVar26 = auVar57._0_4_;
    local_fb8[0] = fVar26 * 1.5 - fVar26 * fVar26 * auVar28._0_4_ * 0.5 * fVar26;
    auVar81._0_4_ = local_1048 * local_fb8[0];
    auVar81._4_4_ = local_1058 * local_fb8[0];
    auVar81._8_4_ = local_1038 * local_fb8[0];
    auVar81._12_4_ = aVar6.field_3.w * local_fb8[0];
    uVar22 = CONCAT44(auVar81._4_4_,auVar81._4_4_);
    auVar29._0_8_ = uVar22 ^ 0x8000000080000000;
    auVar29._8_4_ = -auVar81._12_4_;
    auVar29._12_4_ = -auVar81._12_4_;
    auVar88._0_12_ = ZEXT812(0);
    auVar88._12_4_ = 0;
    auVar29 = blendps(auVar29,auVar88,0xe);
    auVar28._4_4_ = auVar29._0_4_;
    auVar28._0_4_ = auVar81._8_4_;
    auVar28._8_4_ = auVar29._4_4_;
    auVar28._12_4_ = 0;
    auVar57._4_4_ = auVar29._0_4_;
    auVar57._0_4_ = auVar81._8_4_;
    auVar57._8_4_ = auVar29._4_4_;
    auVar57._12_4_ = 0;
    auVar98 = dpps(auVar57 << 0x20,auVar28 << 0x20,0x7f);
    uVar22 = CONCAT44(auVar81._12_4_,auVar81._8_4_);
    auVar83._0_8_ = uVar22 ^ 0x8000000080000000;
    auVar83._8_4_ = -auVar81._8_4_;
    auVar83._12_4_ = -auVar81._12_4_;
    auVar29 = insertps(auVar83,auVar81,0x2a);
    auVar57 = dpps(auVar29,auVar29,0x7f);
    iVar25 = -(uint)(auVar57._0_4_ < auVar98._0_4_);
    auVar98._4_4_ = iVar25;
    auVar98._0_4_ = iVar25;
    auVar98._8_4_ = iVar25;
    auVar98._12_4_ = iVar25;
    auVar28 = blendvps(auVar29,auVar28 << 0x20,auVar98);
    auVar57 = dpps(auVar28,auVar28,0x7f);
    auVar29 = rsqrtss(auVar57,auVar57);
    fVar26 = auVar29._0_4_;
    fVar26 = fVar26 * 1.5 - fVar26 * fVar26 * auVar57._0_4_ * 0.5 * fVar26;
    fVar27 = fVar26 * auVar28._0_4_;
    fVar46 = fVar26 * auVar28._4_4_;
    fVar48 = fVar26 * auVar28._8_4_;
    fVar26 = fVar26 * auVar28._12_4_;
    fVar82 = fVar46 * auVar81._0_4_ - auVar81._4_4_ * fVar27;
    fVar89 = fVar48 * auVar81._4_4_ - auVar81._8_4_ * fVar46;
    fVar90 = fVar27 * auVar81._8_4_ - auVar81._0_4_ * fVar48;
    auVar84._12_4_ = fVar26 * auVar81._12_4_ - auVar81._12_4_ * fVar26;
    auVar84._0_8_ = CONCAT44(fVar90,fVar89);
    auVar84._8_4_ = fVar82;
    auVar94._8_4_ = fVar82;
    auVar94._0_8_ = auVar84._0_8_;
    auVar94._12_4_ = auVar84._12_4_;
    auVar28 = dpps(auVar94,auVar84,0x7f);
    auVar57 = rsqrtss(auVar28,auVar28);
    fVar26 = auVar57._0_4_;
    fVar26 = fVar26 * 1.5 - fVar26 * fVar26 * auVar28._0_4_ * 0.5 * fVar26;
    local_f88._4_4_ = fVar26 * fVar82;
    local_f88._0_4_ = fVar48;
    local_f88._8_4_ = auVar81._8_4_ * local_fb8[0];
    local_f88._12_4_ = 0;
    local_f98._4_4_ = fVar26 * fVar90;
    local_f98._0_4_ = fVar46;
    local_f98._8_4_ = auVar81._4_4_ * local_fb8[0];
    local_f98._12_4_ = 0;
    local_fa8._4_4_ = fVar26 * fVar89;
    local_fa8._0_4_ = fVar27;
    local_fa8._8_4_ = auVar81._0_4_ * local_fb8[0];
    local_fa8._12_4_ = 0;
    uStack_f70 = 0;
    local_1088 = (ray->super_RayK<1>).org.field_0.m128[0];
    local_10d8 = (ray->super_RayK<1>).org.field_0.m128[1];
    local_10e8 = (ray->super_RayK<1>).org.field_0.m128[2];
    fVar27 = *(float *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
    fVar26 = 0.0;
    if (0.0 <= fVar27) {
      fVar26 = fVar27;
    }
    fVar27 = (ray->super_RayK<1>).tfar;
    fVar46 = 0.0;
    if (0.0 <= fVar27) {
      fVar46 = fVar27;
    }
    auVar30._4_4_ = -(uint)(ABS(local_1058) < DAT_01f4bd50._4_4_);
    auVar30._0_4_ = -(uint)(ABS(local_1048) < (float)DAT_01f4bd50);
    auVar30._8_4_ = -(uint)(ABS(local_1038) < DAT_01f4bd50._8_4_);
    auVar30._12_4_ = -(uint)(ABS(aVar6.field_3.w) < DAT_01f4bd50._12_4_);
    auVar57 = blendvps((undefined1  [16])aVar6,_DAT_01f4bd50,auVar30);
    auVar28 = rcpps(auVar30,auVar57);
    local_1098 = auVar28._0_4_;
    local_10a8 = auVar28._4_4_;
    local_1078 = auVar28._8_4_;
    local_1098 = (1.0 - auVar57._0_4_ * local_1098) * local_1098 + local_1098;
    local_10a8 = (1.0 - auVar57._4_4_ * local_10a8) * local_10a8 + local_10a8;
    local_1078 = (1.0 - auVar57._8_4_ * local_1078) * local_1078 + local_1078;
    fStack_1044 = local_1048;
    fStack_1040 = local_1048;
    fStack_103c = local_1048;
    fStack_1054 = local_1058;
    fStack_1050 = local_1058;
    fStack_104c = local_1058;
    fStack_1034 = local_1038;
    fStack_1030 = local_1038;
    fStack_102c = local_1038;
    uVar24 = (ulong)(local_1098 < 0.0) * 0x10;
    uVar23 = (ulong)(local_10a8 < 0.0) << 4 | 0x20;
    uVar22 = (ulong)(local_1078 < 0.0) << 4 | 0x40;
    local_1068._4_4_ = fVar26;
    local_1068._0_4_ = fVar26;
    local_1068._8_4_ = fVar26;
    local_1068._12_4_ = fVar26;
    fStack_10e4 = local_10e8;
    fStack_10e0 = local_10e8;
    fStack_10dc = local_10e8;
    fStack_1074 = local_1078;
    fStack_1070 = local_1078;
    fStack_106c = local_1078;
    fStack_1084 = local_1088;
    fStack_1080 = local_1088;
    fStack_107c = local_1088;
    fStack_10d4 = local_10d8;
    fStack_10d0 = local_10d8;
    fStack_10cc = local_10d8;
    fStack_1094 = local_1098;
    fStack_1090 = local_1098;
    fStack_108c = local_1098;
    fStack_10a4 = local_10a8;
    fStack_10a0 = local_10a8;
    fStack_109c = local_10a8;
    local_10c0 = ray;
    local_10f8 = (undefined1 (*) [16])local_f68;
    fVar26 = fVar46;
    fVar27 = fVar46;
    fVar48 = fVar46;
    auVar28 = local_1068;
    fVar82 = local_1098;
    fVar89 = local_1098;
    fVar90 = local_1098;
    fVar105 = local_1098;
    fVar74 = local_1088;
    fVar47 = local_1088;
    fVar102 = local_1088;
    fVar75 = local_1088;
    fVar49 = local_10e8;
    fVar103 = local_10e8;
    fVar76 = local_10e8;
    fVar50 = local_10e8;
    fVar55 = local_10d8;
    fVar56 = local_10d8;
    fVar63 = local_10d8;
    fVar64 = local_10d8;
    fVar65 = local_1078;
    fVar66 = local_1078;
    fVar67 = local_1078;
    fVar68 = local_1078;
    fVar91 = local_10a8;
    fVar92 = local_10a8;
    fVar93 = local_10a8;
    fVar95 = local_10a8;
LAB_0067b54f:
    if (local_10f8 != (undefined1 (*) [16])&local_f78) {
      pauVar21 = local_10f8 + -1;
      local_10f8 = local_10f8 + -1;
      pfVar1 = &(ray->super_RayK<1>).tfar;
      if (*(float *)((long)*pauVar21 + 8) < *pfVar1 || *(float *)((long)*pauVar21 + 8) == *pfVar1) {
        uVar19 = *(ulong *)*local_10f8;
        pauVar21 = local_10f8;
        while ((uVar19 & 8) == 0) {
          fVar5 = (ray->super_RayK<1>).dir.field_0.m128[3];
          uVar18 = (uint)uVar19 & 7;
          uVar20 = uVar19 & 0xfffffffffffffff0;
          if (uVar18 == 3) {
            local_fe8 = *(float *)(uVar20 + 0x20);
            fStack_fe4 = *(float *)(uVar20 + 0x24);
            fStack_fe0 = *(float *)(uVar20 + 0x28);
            fStack_fdc = *(float *)(uVar20 + 0x2c);
            local_ff8 = *(float *)(uVar20 + 0x30);
            fStack_ff4 = *(float *)(uVar20 + 0x34);
            fStack_ff0 = *(float *)(uVar20 + 0x38);
            fStack_fec = *(float *)(uVar20 + 0x3c);
            local_1018 = *(float *)(uVar20 + 0x50);
            fStack_1014 = *(float *)(uVar20 + 0x54);
            fStack_1010 = *(float *)(uVar20 + 0x58);
            fStack_100c = *(float *)(uVar20 + 0x5c);
            local_1008 = *(float *)(uVar20 + 0x60);
            fStack_1004 = *(float *)(uVar20 + 100);
            fStack_1000 = *(float *)(uVar20 + 0x68);
            fStack_ffc = *(float *)(uVar20 + 0x6c);
            local_1028 = *(undefined8 *)(uVar20 + 0x70);
            uStack_1020 = *(undefined8 *)(uVar20 + 0x78);
            uVar16 = local_1028;
            uVar17 = uStack_1020;
            local_10f8 = *(undefined1 (**) [16])(uVar20 + 0xa0);
            uStack_10f0 = *(undefined8 *)(uVar20 + 0xa8);
            uVar10 = uStack_10f0;
            fVar91 = 1.0 - fVar5;
            fVar92 = fVar91 * 0.0;
            local_fd8 = *(float *)(uVar20 + 0xe0) * fVar5 + fVar92;
            fStack_fd4 = *(float *)(uVar20 + 0xe4) * fVar5 + fVar92;
            fStack_fd0 = *(float *)(uVar20 + 0xe8) * fVar5 + fVar92;
            fStack_fcc = *(float *)(uVar20 + 0xec) * fVar5 + fVar92;
            local_fc8 = *(float *)(uVar20 + 0xf0) * fVar5 + fVar92;
            fStack_fc4 = *(float *)(uVar20 + 0xf4) * fVar5 + fVar92;
            fStack_fc0 = *(float *)(uVar20 + 0xf8) * fVar5 + fVar92;
            fStack_fbc = *(float *)(uVar20 + 0xfc) * fVar5 + fVar92;
            auVar71._0_4_ =
                 local_1048 * local_fe8 +
                 local_1058 * local_1018 + local_1038 * *(float *)(uVar20 + 0x80);
            auVar71._4_4_ =
                 fStack_1044 * fStack_fe4 +
                 fStack_1054 * fStack_1014 + fStack_1034 * *(float *)(uVar20 + 0x84);
            auVar71._8_4_ =
                 fStack_1040 * fStack_fe0 +
                 fStack_1050 * fStack_1010 + fStack_1030 * *(float *)(uVar20 + 0x88);
            auVar71._12_4_ =
                 fStack_103c * fStack_fdc +
                 fStack_104c * fStack_100c + fStack_102c * *(float *)(uVar20 + 0x8c);
            auVar78._0_4_ =
                 local_1048 * local_ff8 +
                 local_1058 * local_1008 + local_1038 * *(float *)(uVar20 + 0x90);
            auVar78._4_4_ =
                 fStack_1044 * fStack_ff4 +
                 fStack_1054 * fStack_1004 + fStack_1034 * *(float *)(uVar20 + 0x94);
            auVar78._8_4_ =
                 fStack_1040 * fStack_ff0 +
                 fStack_1050 * fStack_1000 + fStack_1030 * *(float *)(uVar20 + 0x98);
            auVar78._12_4_ =
                 fStack_103c * fStack_fec +
                 fStack_104c * fStack_ffc + fStack_102c * *(float *)(uVar20 + 0x9c);
            fVar82 = (float)DAT_01f4bd50;
            fVar89 = DAT_01f4bd50._4_4_;
            fVar90 = DAT_01f4bd50._8_4_;
            fVar105 = DAT_01f4bd50._12_4_;
            auVar33._4_4_ = -(uint)(ABS(auVar71._4_4_) < fVar89);
            auVar33._0_4_ = -(uint)(ABS(auVar71._0_4_) < fVar82);
            auVar33._8_4_ = -(uint)(ABS(auVar71._8_4_) < fVar90);
            auVar33._12_4_ = -(uint)(ABS(auVar71._12_4_) < fVar105);
            auVar29 = blendvps(auVar71,_DAT_01f4bd50,auVar33);
            auVar34._4_4_ = -(uint)(ABS(auVar78._4_4_) < fVar89);
            auVar34._0_4_ = -(uint)(ABS(auVar78._0_4_) < fVar82);
            auVar34._8_4_ = -(uint)(ABS(auVar78._8_4_) < fVar90);
            auVar34._12_4_ = -(uint)(ABS(auVar78._12_4_) < fVar105);
            auVar98 = blendvps(auVar78,_DAT_01f4bd50,auVar34);
            local_10f8._4_4_ = (float)((ulong)local_10f8 >> 0x20);
            uStack_10f0._4_4_ = (float)((ulong)uStack_10f0 >> 0x20);
            local_1028._4_4_ = (float)((ulong)local_1028 >> 0x20);
            uStack_1020._4_4_ = (float)((ulong)uStack_1020 >> 0x20);
            auVar59._0_4_ =
                 local_1048 * *(float *)(uVar20 + 0x40) +
                 local_1058 * (float)local_1028 + local_1038 * (float)local_10f8;
            auVar59._4_4_ =
                 fStack_1044 * *(float *)(uVar20 + 0x44) +
                 fStack_1054 * local_1028._4_4_ + fStack_1034 * local_10f8._4_4_;
            auVar59._8_4_ =
                 fStack_1040 * *(float *)(uVar20 + 0x48) +
                 fStack_1050 * (float)uStack_1020 + fStack_1030 * (float)uStack_10f0;
            auVar59._12_4_ =
                 fStack_103c * *(float *)(uVar20 + 0x4c) +
                 fStack_104c * uStack_1020._4_4_ + fStack_102c * uStack_10f0._4_4_;
            auVar35._4_4_ = -(uint)(ABS(auVar59._4_4_) < fVar89);
            auVar35._0_4_ = -(uint)(ABS(auVar59._0_4_) < fVar82);
            auVar35._8_4_ = -(uint)(ABS(auVar59._8_4_) < fVar90);
            auVar35._12_4_ = -(uint)(ABS(auVar59._12_4_) < fVar105);
            auVar57 = blendvps(auVar59,_DAT_01f4bd50,auVar35);
            auVar28 = rcpps(auVar35,auVar29);
            fVar82 = auVar28._0_4_;
            fVar105 = auVar28._4_4_;
            fVar102 = auVar28._8_4_;
            fVar103 = auVar28._12_4_;
            fVar82 = (1.0 - auVar29._0_4_ * fVar82) * fVar82 + fVar82;
            fVar105 = (1.0 - auVar29._4_4_ * fVar105) * fVar105 + fVar105;
            fVar102 = (1.0 - auVar29._8_4_ * fVar102) * fVar102 + fVar102;
            fVar103 = (1.0 - auVar29._12_4_ * fVar103) * fVar103 + fVar103;
            auVar28 = rcpps(auVar28,auVar98);
            fVar89 = auVar28._0_4_;
            auVar79._0_4_ = auVar98._0_4_ * fVar89;
            fVar74 = auVar28._4_4_;
            auVar79._4_4_ = auVar98._4_4_ * fVar74;
            fVar75 = auVar28._8_4_;
            auVar79._8_4_ = auVar98._8_4_ * fVar75;
            fVar76 = auVar28._12_4_;
            auVar79._12_4_ = auVar98._12_4_ * fVar76;
            fVar89 = (1.0 - auVar79._0_4_) * fVar89 + fVar89;
            fVar74 = (1.0 - auVar79._4_4_) * fVar74 + fVar74;
            fVar75 = (1.0 - auVar79._8_4_) * fVar75 + fVar75;
            fVar76 = (1.0 - auVar79._12_4_) * fVar76 + fVar76;
            auVar28 = rcpps(auVar79,auVar57);
            fVar90 = auVar28._0_4_;
            fVar47 = auVar28._4_4_;
            fVar49 = auVar28._8_4_;
            fVar50 = auVar28._12_4_;
            fVar90 = (1.0 - auVar57._0_4_ * fVar90) * fVar90 + fVar90;
            fVar47 = (1.0 - auVar57._4_4_ * fVar47) * fVar47 + fVar47;
            fVar49 = (1.0 - auVar57._8_4_ * fVar49) * fVar49 + fVar49;
            fVar50 = (1.0 - auVar57._12_4_ * fVar50) * fVar50 + fVar50;
            fVar55 = local_fe8 * local_1088 +
                     local_1018 * local_10d8 +
                     *(float *)(uVar20 + 0x80) * local_10e8 + *(float *)(uVar20 + 0xb0);
            fVar63 = fStack_fe4 * fStack_1084 +
                     fStack_1014 * fStack_10d4 +
                     *(float *)(uVar20 + 0x84) * fStack_10e4 + *(float *)(uVar20 + 0xb4);
            fVar65 = fStack_fe0 * fStack_1080 +
                     fStack_1010 * fStack_10d0 +
                     *(float *)(uVar20 + 0x88) * fStack_10e0 + *(float *)(uVar20 + 0xb8);
            fVar67 = fStack_fdc * fStack_107c +
                     fStack_100c * fStack_10cc +
                     *(float *)(uVar20 + 0x8c) * fStack_10dc + *(float *)(uVar20 + 0xbc);
            fVar56 = local_ff8 * local_1088 +
                     local_1008 * local_10d8 +
                     *(float *)(uVar20 + 0x90) * local_10e8 + *(float *)(uVar20 + 0xc0);
            fVar64 = fStack_ff4 * fStack_1084 +
                     fStack_1004 * fStack_10d4 +
                     *(float *)(uVar20 + 0x94) * fStack_10e4 + *(float *)(uVar20 + 0xc4);
            fVar66 = fStack_ff0 * fStack_1080 +
                     fStack_1000 * fStack_10d0 +
                     *(float *)(uVar20 + 0x98) * fStack_10e0 + *(float *)(uVar20 + 200);
            fVar68 = fStack_fec * fStack_107c +
                     fStack_ffc * fStack_10cc +
                     *(float *)(uVar20 + 0x9c) * fStack_10dc + *(float *)(uVar20 + 0xcc);
            fVar106 = *(float *)(uVar20 + 0x40) * local_1088 +
                      (float)local_1028 * local_10d8 +
                      (float)local_10f8 * local_10e8 + *(float *)(uVar20 + 0xd0);
            fVar107 = *(float *)(uVar20 + 0x44) * fStack_1084 +
                      local_1028._4_4_ * fStack_10d4 +
                      local_10f8._4_4_ * fStack_10e4 + *(float *)(uVar20 + 0xd4);
            fVar108 = *(float *)(uVar20 + 0x48) * fStack_1080 +
                      (float)uStack_1020 * fStack_10d0 +
                      (float)uStack_10f0 * fStack_10e0 + *(float *)(uVar20 + 0xd8);
            fVar109 = *(float *)(uVar20 + 0x4c) * fStack_107c +
                      uStack_1020._4_4_ * fStack_10cc +
                      uStack_10f0._4_4_ * fStack_10dc + *(float *)(uVar20 + 0xdc);
            fVar97 = (local_fd8 - fVar55) * fVar82;
            fVar99 = (fStack_fd4 - fVar63) * fVar105;
            fVar100 = (fStack_fd0 - fVar65) * fVar102;
            fVar101 = (fStack_fcc - fVar67) * fVar103;
            fVar82 = ((*(float *)(uVar20 + 0x110) * fVar5 + fVar91) - fVar55) * fVar82;
            fVar105 = ((*(float *)(uVar20 + 0x114) * fVar5 + fVar91) - fVar63) * fVar105;
            fVar102 = ((*(float *)(uVar20 + 0x118) * fVar5 + fVar91) - fVar65) * fVar102;
            fVar103 = ((*(float *)(uVar20 + 0x11c) * fVar5 + fVar91) - fVar67) * fVar103;
            fVar55 = (local_fc8 - fVar56) * fVar89;
            fVar63 = (fStack_fc4 - fVar64) * fVar74;
            fVar65 = (fStack_fc0 - fVar66) * fVar75;
            fVar67 = (fStack_fbc - fVar68) * fVar76;
            fVar93 = ((fVar92 + *(float *)(uVar20 + 0x100) * fVar5) - fVar106) * fVar90;
            fVar95 = ((fVar92 + *(float *)(uVar20 + 0x104) * fVar5) - fVar107) * fVar47;
            fVar96 = ((fVar92 + *(float *)(uVar20 + 0x108) * fVar5) - fVar108) * fVar49;
            fVar92 = ((fVar92 + *(float *)(uVar20 + 0x10c) * fVar5) - fVar109) * fVar50;
            fVar89 = ((*(float *)(uVar20 + 0x120) * fVar5 + fVar91) - fVar56) * fVar89;
            fVar74 = ((*(float *)(uVar20 + 0x124) * fVar5 + fVar91) - fVar64) * fVar74;
            fVar75 = ((*(float *)(uVar20 + 0x128) * fVar5 + fVar91) - fVar66) * fVar75;
            fVar76 = ((*(float *)(uVar20 + 300) * fVar5 + fVar91) - fVar68) * fVar76;
            fVar90 = ((fVar5 * *(float *)(uVar20 + 0x130) + fVar91) - fVar106) * fVar90;
            fVar47 = ((fVar5 * *(float *)(uVar20 + 0x134) + fVar91) - fVar107) * fVar47;
            fVar49 = ((fVar5 * *(float *)(uVar20 + 0x138) + fVar91) - fVar108) * fVar49;
            fVar50 = ((fVar5 * *(float *)(uVar20 + 0x13c) + fVar91) - fVar109) * fVar50;
            auVar36._0_4_ =
                 (uint)((int)fVar89 < (int)fVar55) * (int)fVar89 |
                 (uint)((int)fVar89 >= (int)fVar55) * (int)fVar55;
            auVar36._4_4_ =
                 (uint)((int)fVar74 < (int)fVar63) * (int)fVar74 |
                 (uint)((int)fVar74 >= (int)fVar63) * (int)fVar63;
            auVar36._8_4_ =
                 (uint)((int)fVar75 < (int)fVar65) * (int)fVar75 |
                 (uint)((int)fVar75 >= (int)fVar65) * (int)fVar65;
            auVar36._12_4_ =
                 (uint)((int)fVar76 < (int)fVar67) * (int)fVar76 |
                 (uint)((int)fVar76 >= (int)fVar67) * (int)fVar67;
            auVar60._0_4_ =
                 (uint)((int)fVar90 < (int)fVar93) * (int)fVar90 |
                 (uint)((int)fVar90 >= (int)fVar93) * (int)fVar93;
            auVar60._4_4_ =
                 (uint)((int)fVar47 < (int)fVar95) * (int)fVar47 |
                 (uint)((int)fVar47 >= (int)fVar95) * (int)fVar95;
            auVar60._8_4_ =
                 (uint)((int)fVar49 < (int)fVar96) * (int)fVar49 |
                 (uint)((int)fVar49 >= (int)fVar96) * (int)fVar96;
            auVar60._12_4_ =
                 (uint)((int)fVar50 < (int)fVar92) * (int)fVar50 |
                 (uint)((int)fVar50 >= (int)fVar92) * (int)fVar92;
            auVar28 = maxps(auVar36,auVar60);
            auVar61._0_4_ =
                 (uint)((int)fVar82 < (int)fVar97) * (int)fVar82 |
                 (uint)((int)fVar82 >= (int)fVar97) * (int)fVar97;
            auVar61._4_4_ =
                 (uint)((int)fVar105 < (int)fVar99) * (int)fVar105 |
                 (uint)((int)fVar105 >= (int)fVar99) * (int)fVar99;
            auVar61._8_4_ =
                 (uint)((int)fVar102 < (int)fVar100) * (int)fVar102 |
                 (uint)((int)fVar102 >= (int)fVar100) * (int)fVar100;
            auVar61._12_4_ =
                 (uint)((int)fVar103 < (int)fVar101) * (int)fVar103 |
                 (uint)((int)fVar103 >= (int)fVar101) * (int)fVar101;
            auVar86._0_4_ =
                 (uint)((int)fVar82 < (int)fVar97) * (int)fVar97 |
                 (uint)((int)fVar82 >= (int)fVar97) * (int)fVar82;
            auVar86._4_4_ =
                 (uint)((int)fVar105 < (int)fVar99) * (int)fVar99 |
                 (uint)((int)fVar105 >= (int)fVar99) * (int)fVar105;
            auVar86._8_4_ =
                 (uint)((int)fVar102 < (int)fVar100) * (int)fVar100 |
                 (uint)((int)fVar102 >= (int)fVar100) * (int)fVar102;
            auVar86._12_4_ =
                 (uint)((int)fVar103 < (int)fVar101) * (int)fVar101 |
                 (uint)((int)fVar103 >= (int)fVar101) * (int)fVar103;
            auVar104._0_4_ =
                 (uint)((int)fVar89 < (int)fVar55) * (int)fVar55 |
                 (uint)((int)fVar89 >= (int)fVar55) * (int)fVar89;
            auVar104._4_4_ =
                 (uint)((int)fVar74 < (int)fVar63) * (int)fVar63 |
                 (uint)((int)fVar74 >= (int)fVar63) * (int)fVar74;
            auVar104._8_4_ =
                 (uint)((int)fVar75 < (int)fVar65) * (int)fVar65 |
                 (uint)((int)fVar75 >= (int)fVar65) * (int)fVar75;
            auVar104._12_4_ =
                 (uint)((int)fVar76 < (int)fVar67) * (int)fVar67 |
                 (uint)((int)fVar76 >= (int)fVar67) * (int)fVar76;
            auVar52._0_4_ =
                 (uint)((int)fVar90 < (int)fVar93) * (int)fVar93 |
                 (uint)((int)fVar90 >= (int)fVar93) * (int)fVar90;
            auVar52._4_4_ =
                 (uint)((int)fVar47 < (int)fVar95) * (int)fVar95 |
                 (uint)((int)fVar47 >= (int)fVar95) * (int)fVar47;
            auVar52._8_4_ =
                 (uint)((int)fVar49 < (int)fVar96) * (int)fVar96 |
                 (uint)((int)fVar49 >= (int)fVar96) * (int)fVar49;
            auVar52._12_4_ =
                 (uint)((int)fVar50 < (int)fVar92) * (int)fVar92 |
                 (uint)((int)fVar50 >= (int)fVar92) * (int)fVar50;
            auVar29 = minps(auVar104,auVar52);
            auVar57 = maxps(local_1068,auVar61);
            local_1108 = maxps(auVar57,auVar28);
            auVar37._4_4_ = fVar26;
            auVar37._0_4_ = fVar46;
            auVar37._8_4_ = fVar27;
            auVar37._12_4_ = fVar48;
            auVar28 = minps(auVar37,auVar86);
            auVar28 = minps(auVar28,auVar29);
            auVar53._4_4_ = -(uint)(local_1108._4_4_ <= auVar28._4_4_);
            auVar53._0_4_ = -(uint)(local_1108._0_4_ <= auVar28._0_4_);
            auVar53._8_4_ = -(uint)(local_1108._8_4_ <= auVar28._8_4_);
            auVar53._12_4_ = -(uint)(local_1108._12_4_ <= auVar28._12_4_);
            uVar18 = movmskps((int)context,auVar53);
            auVar28 = local_1068;
            fVar82 = local_1098;
            fVar89 = fStack_1094;
            fVar90 = fStack_1090;
            fVar105 = fStack_108c;
            fVar74 = local_1088;
            fVar47 = fStack_1084;
            fVar102 = fStack_1080;
            fVar75 = fStack_107c;
            fVar49 = local_10e8;
            fVar103 = fStack_10e4;
            fVar76 = fStack_10e0;
            fVar50 = fStack_10dc;
            fVar55 = local_10d8;
            fVar56 = fStack_10d4;
            fVar63 = fStack_10d0;
            fVar64 = fStack_10cc;
            fVar65 = local_1078;
            fVar66 = fStack_1074;
            fVar67 = fStack_1070;
            fVar68 = fStack_106c;
            fVar91 = local_10a8;
            fVar92 = fStack_10a4;
            fVar93 = fStack_10a0;
            fVar95 = fStack_109c;
            uStack_10f0 = uVar10;
            local_1028 = uVar16;
            uStack_1020 = uVar17;
          }
          else {
            pfVar3 = (float *)(uVar20 + 0x80 + uVar24);
            pfVar1 = (float *)(uVar20 + 0x20 + uVar24);
            pfVar4 = (float *)(uVar20 + 0x80 + uVar23);
            pfVar2 = (float *)(uVar20 + 0x20 + uVar23);
            auVar31._0_4_ = ((*pfVar3 * fVar5 + *pfVar1) - fVar74) * fVar82;
            auVar31._4_4_ = ((pfVar3[1] * fVar5 + pfVar1[1]) - fVar47) * fVar89;
            auVar31._8_4_ = ((pfVar3[2] * fVar5 + pfVar1[2]) - fVar102) * fVar90;
            auVar31._12_4_ = ((pfVar3[3] * fVar5 + pfVar1[3]) - fVar75) * fVar105;
            auVar58._0_4_ = ((*pfVar4 * fVar5 + *pfVar2) - fVar55) * fVar91;
            auVar58._4_4_ = ((pfVar4[1] * fVar5 + pfVar2[1]) - fVar56) * fVar92;
            auVar58._8_4_ = ((pfVar4[2] * fVar5 + pfVar2[2]) - fVar63) * fVar93;
            auVar58._12_4_ = ((pfVar4[3] * fVar5 + pfVar2[3]) - fVar64) * fVar95;
            pfVar2 = (float *)(uVar20 + 0x80 + uVar22);
            pfVar1 = (float *)(uVar20 + 0x20 + uVar22);
            auVar69._0_4_ = ((*pfVar2 * fVar5 + *pfVar1) - fVar49) * fVar65;
            auVar69._4_4_ = ((pfVar2[1] * fVar5 + pfVar1[1]) - fVar103) * fVar66;
            auVar69._8_4_ = ((pfVar2[2] * fVar5 + pfVar1[2]) - fVar76) * fVar67;
            auVar69._12_4_ = ((pfVar2[3] * fVar5 + pfVar1[3]) - fVar50) * fVar68;
            auVar57 = maxps(auVar58,auVar69);
            pfVar2 = (float *)(uVar20 + 0x80 + (uVar24 ^ 0x10));
            pfVar1 = (float *)(uVar20 + 0x20 + (uVar24 ^ 0x10));
            auVar77._0_4_ = ((*pfVar2 * fVar5 + *pfVar1) - fVar74) * fVar82;
            auVar77._4_4_ = ((pfVar2[1] * fVar5 + pfVar1[1]) - fVar47) * fVar89;
            auVar77._8_4_ = ((pfVar2[2] * fVar5 + pfVar1[2]) - fVar102) * fVar90;
            auVar77._12_4_ = ((pfVar2[3] * fVar5 + pfVar1[3]) - fVar75) * fVar105;
            pfVar2 = (float *)(uVar20 + 0x80 + (uVar23 ^ 0x10));
            pfVar1 = (float *)(uVar20 + 0x20 + (uVar23 ^ 0x10));
            auVar85._0_4_ = ((*pfVar2 * fVar5 + *pfVar1) - fVar55) * fVar91;
            auVar85._4_4_ = ((pfVar2[1] * fVar5 + pfVar1[1]) - fVar56) * fVar92;
            auVar85._8_4_ = ((pfVar2[2] * fVar5 + pfVar1[2]) - fVar63) * fVar93;
            auVar85._12_4_ = ((pfVar2[3] * fVar5 + pfVar1[3]) - fVar64) * fVar95;
            pfVar2 = (float *)(uVar20 + 0x80 + (uVar22 ^ 0x10));
            pfVar1 = (float *)(uVar20 + 0x20 + (uVar22 ^ 0x10));
            auVar70._0_4_ = ((*pfVar2 * fVar5 + *pfVar1) - fVar49) * fVar65;
            auVar70._4_4_ = ((pfVar2[1] * fVar5 + pfVar1[1]) - fVar103) * fVar66;
            auVar70._8_4_ = ((pfVar2[2] * fVar5 + pfVar1[2]) - fVar76) * fVar67;
            auVar70._12_4_ = ((pfVar2[3] * fVar5 + pfVar1[3]) - fVar50) * fVar68;
            auVar98 = minps(auVar85,auVar70);
            auVar29 = maxps(auVar28,auVar31);
            local_1108 = maxps(auVar29,auVar57);
            auVar32._4_4_ = fVar26;
            auVar32._0_4_ = fVar46;
            auVar32._8_4_ = fVar27;
            auVar32._12_4_ = fVar48;
            auVar57 = minps(auVar32,auVar77);
            auVar57 = minps(auVar57,auVar98);
            if (uVar18 == 6) {
              bVar12 = (fVar5 < *(float *)(uVar20 + 0xf0) && *(float *)(uVar20 + 0xe0) <= fVar5) &&
                       local_1108._0_4_ <= auVar57._0_4_;
              bVar13 = (fVar5 < *(float *)(uVar20 + 0xf4) && *(float *)(uVar20 + 0xe4) <= fVar5) &&
                       local_1108._4_4_ <= auVar57._4_4_;
              bVar14 = (fVar5 < *(float *)(uVar20 + 0xf8) && *(float *)(uVar20 + 0xe8) <= fVar5) &&
                       local_1108._8_4_ <= auVar57._8_4_;
              bVar15 = (fVar5 < *(float *)(uVar20 + 0xfc) && *(float *)(uVar20 + 0xec) <= fVar5) &&
                       local_1108._12_4_ <= auVar57._12_4_;
            }
            else {
              bVar12 = local_1108._0_4_ <= auVar57._0_4_;
              bVar13 = local_1108._4_4_ <= auVar57._4_4_;
              bVar14 = local_1108._8_4_ <= auVar57._8_4_;
              bVar15 = local_1108._12_4_ <= auVar57._12_4_;
            }
            auVar51._0_4_ = (uint)bVar12 * -0x80000000;
            auVar51._4_4_ = (uint)bVar13 * -0x80000000;
            auVar51._8_4_ = (uint)bVar14 * -0x80000000;
            auVar51._12_4_ = (uint)bVar15 * -0x80000000;
            uVar18 = movmskps((int)context,auVar51);
          }
          context = (RayQueryContext *)CONCAT44((int)((ulong)context >> 0x20),uVar18);
          local_10f8 = pauVar21;
          if (context == (RayQueryContext *)0x0) goto LAB_0067b54f;
          lVar11 = 0;
          if (context != (RayQueryContext *)0x0) {
            for (; ((ulong)context >> lVar11 & 1) == 0; lVar11 = lVar11 + 1) {
            }
          }
          uVar19 = *(ulong *)(uVar20 + lVar11 * 8);
          uVar18 = uVar18 - 1 & uVar18;
          if (uVar18 != 0) {
            uVar7 = *(uint *)(local_1108 + lVar11 * 4);
            lVar11 = 0;
            if (uVar18 != 0) {
              for (; (uVar18 >> lVar11 & 1) == 0; lVar11 = lVar11 + 1) {
              }
            }
            uVar9 = *(ulong *)(uVar20 + lVar11 * 8);
            uVar8 = *(uint *)(local_1108 + lVar11 * 4);
            uVar18 = uVar18 - 1 & uVar18;
            context = (RayQueryContext *)(ulong)uVar18;
            if (uVar18 == 0) {
              if (uVar7 < uVar8) {
                *(ulong *)*pauVar21 = uVar9;
                *(uint *)((long)*pauVar21 + 8) = uVar8;
                pauVar21 = pauVar21 + 1;
              }
              else {
                *(ulong *)*pauVar21 = uVar19;
                *(uint *)((long)*pauVar21 + 8) = uVar7;
                uVar19 = uVar9;
                pauVar21 = pauVar21 + 1;
              }
            }
            else {
              auVar54._8_4_ = uVar7;
              auVar54._0_8_ = uVar19;
              auVar54._12_4_ = 0;
              auVar72._8_4_ = uVar8;
              auVar72._0_8_ = uVar9;
              auVar72._12_4_ = 0;
              lVar11 = 0;
              if (context != (RayQueryContext *)0x0) {
                for (; (uVar18 >> lVar11 & 1) == 0; lVar11 = lVar11 + 1) {
                }
              }
              uVar10 = *(undefined8 *)(uVar20 + lVar11 * 8);
              iVar25 = *(int *)(local_1108 + lVar11 * 4);
              auVar62._8_4_ = iVar25;
              auVar62._0_8_ = uVar10;
              auVar62._12_4_ = 0;
              auVar38._8_4_ = -(uint)((int)uVar7 < (int)uVar8);
              uVar18 = uVar18 - 1 & uVar18;
              if (uVar18 == 0) {
                auVar38._4_4_ = auVar38._8_4_;
                auVar38._0_4_ = auVar38._8_4_;
                auVar38._12_4_ = auVar38._8_4_;
                auVar80._8_4_ = uVar8;
                auVar80._0_8_ = uVar9;
                auVar80._12_4_ = 0;
                auVar29 = blendvps(auVar80,auVar54,auVar38);
                auVar57 = blendvps(auVar54,auVar72,auVar38);
                auVar39._8_4_ = -(uint)(auVar29._8_4_ < iVar25);
                auVar39._4_4_ = auVar39._8_4_;
                auVar39._0_4_ = auVar39._8_4_;
                auVar39._12_4_ = auVar39._8_4_;
                auVar73._8_4_ = iVar25;
                auVar73._0_8_ = uVar10;
                auVar73._12_4_ = 0;
                auVar98 = blendvps(auVar73,auVar29,auVar39);
                auVar81 = blendvps(auVar29,auVar62,auVar39);
                auVar40._8_4_ = -(uint)(auVar57._8_4_ < auVar81._8_4_);
                auVar40._4_4_ = auVar40._8_4_;
                auVar40._0_4_ = auVar40._8_4_;
                auVar40._12_4_ = auVar40._8_4_;
                auVar29 = blendvps(auVar81,auVar57,auVar40);
                auVar57 = blendvps(auVar57,auVar81,auVar40);
                *pauVar21 = auVar57;
                pauVar21[1] = auVar29;
                uVar19 = auVar98._0_8_;
                pauVar21 = pauVar21 + 2;
              }
              else {
                lVar11 = 0;
                if (uVar18 != 0) {
                  for (; (uVar18 >> lVar11 & 1) == 0; lVar11 = lVar11 + 1) {
                  }
                }
                auVar41._4_4_ = auVar38._8_4_;
                auVar41._0_4_ = auVar38._8_4_;
                auVar41._8_4_ = auVar38._8_4_;
                auVar41._12_4_ = auVar38._8_4_;
                auVar81 = blendvps(auVar72,auVar54,auVar41);
                auVar57 = blendvps(auVar54,auVar72,auVar41);
                auVar87._8_4_ = *(int *)(local_1108 + lVar11 * 4);
                auVar87._0_8_ = *(undefined8 *)(uVar20 + lVar11 * 8);
                auVar87._12_4_ = 0;
                auVar42._8_4_ = -(uint)(iVar25 < *(int *)(local_1108 + lVar11 * 4));
                auVar42._4_4_ = auVar42._8_4_;
                auVar42._0_4_ = auVar42._8_4_;
                auVar42._12_4_ = auVar42._8_4_;
                auVar98 = blendvps(auVar87,auVar62,auVar42);
                auVar29 = blendvps(auVar62,auVar87,auVar42);
                auVar43._8_4_ = -(uint)(auVar57._8_4_ < auVar29._8_4_);
                auVar43._4_4_ = auVar43._8_4_;
                auVar43._0_4_ = auVar43._8_4_;
                auVar43._12_4_ = auVar43._8_4_;
                auVar88 = blendvps(auVar29,auVar57,auVar43);
                auVar57 = blendvps(auVar57,auVar29,auVar43);
                auVar44._8_4_ = -(uint)(auVar81._8_4_ < auVar98._8_4_);
                auVar44._4_4_ = auVar44._8_4_;
                auVar44._0_4_ = auVar44._8_4_;
                auVar44._12_4_ = auVar44._8_4_;
                auVar29 = blendvps(auVar98,auVar81,auVar44);
                auVar81 = blendvps(auVar81,auVar98,auVar44);
                auVar45._8_4_ = -(uint)(auVar81._8_4_ < auVar88._8_4_);
                auVar45._4_4_ = auVar45._8_4_;
                auVar45._0_4_ = auVar45._8_4_;
                auVar45._12_4_ = auVar45._8_4_;
                auVar98 = blendvps(auVar88,auVar81,auVar45);
                auVar81 = blendvps(auVar81,auVar88,auVar45);
                *pauVar21 = auVar57;
                pauVar21[1] = auVar81;
                pauVar21[2] = auVar98;
                uVar19 = auVar29._0_8_;
                pauVar21 = pauVar21 + 3;
              }
            }
          }
        }
        local_10f8 = pauVar21;
        (**(code **)((long)local_10b8->leafIntersector +
                    (ulong)*(byte *)(uVar19 & 0xfffffffffffffff0) * 0x40))(local_fb8,ray,local_10b0)
        ;
        fVar46 = (local_10c0->super_RayK<1>).tfar;
        context = extraout_RDX;
        ray = local_10c0;
        fVar26 = fVar46;
        fVar27 = fVar46;
        fVar48 = fVar46;
        auVar28 = local_1068;
        fVar82 = local_1098;
        fVar89 = fStack_1094;
        fVar90 = fStack_1090;
        fVar105 = fStack_108c;
        fVar74 = local_1088;
        fVar47 = fStack_1084;
        fVar102 = fStack_1080;
        fVar75 = fStack_107c;
        fVar49 = local_10e8;
        fVar103 = fStack_10e4;
        fVar76 = fStack_10e0;
        fVar50 = fStack_10dc;
        fVar55 = local_10d8;
        fVar56 = fStack_10d4;
        fVar63 = fStack_10d0;
        fVar64 = fStack_10cc;
        fVar65 = local_1078;
        fVar66 = fStack_1074;
        fVar67 = fStack_1070;
        fVar68 = fStack_106c;
        fVar91 = local_10a8;
        fVar92 = fStack_10a4;
        fVar93 = fStack_10a0;
        fVar95 = fStack_109c;
      }
      goto LAB_0067b54f;
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }